

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O3

void mk_sched_event_free(mk_event *event)

{
  mk_list *pmVar1;
  void *pvVar2;
  
  pvVar2 = pthread_getspecific(mk_tls_sched_worker_node);
  if ((event->type & 0x18U) == 0) {
    event->type = event->type | 0x18;
    pmVar1 = *(mk_list **)((long)pvVar2 + 0x50);
    *(mk_list **)((long)pvVar2 + 0x50) = &event->_head;
    (event->_head).next = (mk_list *)((long)pvVar2 + 0x50);
    (event->_head).prev = pmVar1;
    pmVar1->next = &event->_head;
  }
  return;
}

Assistant:

void mk_sched_event_free(struct mk_event *event)
{
    struct mk_sched_worker *sched = mk_sched_get_thread_conf();

    if ((event->type & MK_EVENT_IDLE) != 0) {
        return;
    }

    event->type |= MK_EVENT_IDLE;
    mk_list_add(&event->_head, &sched->event_free_queue);
}